

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.h
# Opt level: O0

void av1_set_mv_col_limits
               (CommonModeInfoParams *mi_params,FullMvLimits *mv_limits,int mi_col,int mi_width,
               int border)

{
  int iVar1;
  int local_34;
  int local_30;
  int max2;
  int max1;
  int min2;
  int min1;
  int border_local;
  int mi_width_local;
  int mi_col_local;
  FullMvLimits *mv_limits_local;
  CommonModeInfoParams *mi_params_local;
  
  iVar1 = -(mi_col * 4 + border + -8);
  local_30 = -((mi_col + mi_width) * 4 + 8);
  if (local_30 < iVar1) {
    local_30 = iVar1;
  }
  mv_limits->col_min = local_30;
  iVar1 = ((mi_params->mi_cols - mi_col) - mi_width) * 4 + border + -8;
  local_34 = (mi_params->mi_cols - mi_col) * 4 + 8;
  if (iVar1 < local_34) {
    local_34 = iVar1;
  }
  mv_limits->col_max = local_34;
  return;
}

Assistant:

static inline void av1_set_mv_col_limits(
    const CommonModeInfoParams *const mi_params, FullMvLimits *mv_limits,
    int mi_col, int mi_width, int border) {
  const int min1 = -(mi_col * MI_SIZE + border - 2 * AOM_INTERP_EXTEND);
  const int min2 = -(((mi_col + mi_width) * MI_SIZE) + 2 * AOM_INTERP_EXTEND);
  mv_limits->col_min = AOMMAX(min1, min2);
  const int max1 = (mi_params->mi_cols - mi_col - mi_width) * MI_SIZE + border -
                   2 * AOM_INTERP_EXTEND;
  const int max2 =
      (mi_params->mi_cols - mi_col) * MI_SIZE + 2 * AOM_INTERP_EXTEND;
  mv_limits->col_max = AOMMIN(max1, max2);
}